

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

void P_ClearParticles(void)

{
  WORD *pWVar1;
  long lVar2;
  
  lVar2 = 0;
  memset(Particles,0,(ulong)NumParticles << 7);
  ActiveParticles = 0xffff;
  InactiveParticles = 0;
  if (1 < NumParticles) {
    pWVar1 = &Particles->tnext;
    lVar2 = 0;
    do {
      lVar2 = lVar2 + 1;
      *pWVar1 = (WORD)lVar2;
      pWVar1 = pWVar1 + 0x40;
    } while (lVar2 < (long)((ulong)NumParticles - 1));
  }
  Particles[lVar2].tnext = 0xffff;
  return;
}

Assistant:

void P_ClearParticles ()
{
	int i;

	memset (Particles, 0, NumParticles * sizeof(particle_t));
	ActiveParticles = NO_PARTICLE;
	InactiveParticles = 0;
	for (i = 0; i < NumParticles-1; i++)
		Particles[i].tnext = i + 1;
	Particles[i].tnext = NO_PARTICLE;
}